

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char,char32_t>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  wchar32 wVar1;
  bool bVar2;
  char32_t cVar3;
  wchar32 *pwVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  jessilib *this;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar8 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pwVar4 = rhs._M_str;
  pcVar5 = (char *)rhs._M_len;
  pcVar7 = pcVar5;
  do {
    if ((this == (jessilib *)0x0) || (pcVar7 == (char *)0x0)) {
      return this == (jessilib *)0x0 && pcVar7 == (char *)0x0;
    }
    in_string._M_str = pcVar5;
    in_string._M_len = (size_t)pcVar8;
    dVar9 = decode_codepoint_utf8<char>(this,in_string);
    pcVar6 = (char *)dVar9.units;
    if (pcVar6 == (char *)0x0) {
LAB_0022eaa2:
      pcVar5 = (char *)dVar9.units;
      bVar2 = false;
    }
    else {
      wVar1 = *pwVar4;
      pcVar5 = pcVar6;
      if (dVar9.codepoint != wVar1) {
        cVar3 = jessilib::fold(dVar9.codepoint);
        dVar9 = (decode_result)jessilib::fold(wVar1);
        pcVar5 = (char *)dVar9.units;
        if (cVar3 != dVar9.codepoint) goto LAB_0022eaa2;
      }
      pcVar8 = pcVar8 + (long)pcVar6;
      this = this + -(long)pcVar6;
      pwVar4 = pwVar4 + 1;
      pcVar7 = pcVar7 + -1;
      bVar2 = true;
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}